

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O2

bool __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::operator==
          (_ItemSimilarityRecommenderData *this,_ItemSimilarityRecommenderData *other)

{
  bool bVar1;
  __type _Var2;
  
  if (this->num_items == other->num_items) {
    bVar1 = std::operator==((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                             *)this,(_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                                     *)other);
    if (bVar1) {
      bVar1 = std::operator==(&(this->item_shift_values)._M_t,&(other->item_shift_values)._M_t);
      if (bVar1) {
        _Var2 = std::operator==(&this->item_restriction_input_column,
                                &other->item_restriction_input_column);
        if (_Var2) {
          _Var2 = std::operator==(&this->num_recommendations_input_column,
                                  &other->num_recommendations_input_column);
          if (_Var2) {
            _Var2 = std::operator==(&this->item_exclusion_input_column,
                                    &other->item_exclusion_input_column);
            if (_Var2) {
              _Var2 = std::operator==(&this->item_data_input_column,&other->item_data_input_column);
              if (_Var2) {
                _Var2 = std::operator==(&this->item_list_output_column,
                                        &other->item_list_output_column);
                if (_Var2) {
                  _Var2 = std::operator==(&this->item_score_output_column,
                                          &other->item_score_output_column);
                  if (_Var2) {
                    bVar1 = std::operator==(&this->string_id_values,&other->string_id_values);
                    if (bVar1) {
                      bVar1 = std::operator==(&this->integer_id_values,&other->integer_id_values);
                      return bVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool _ItemSimilarityRecommenderData::operator==(const _ItemSimilarityRecommenderData& other) const {
    return (num_items == other.num_items
            && item_interactions == other.item_interactions
            && item_shift_values == other.item_shift_values
            && item_restriction_input_column == other.item_restriction_input_column
            && num_recommendations_input_column == other.num_recommendations_input_column
            && item_exclusion_input_column == other.item_exclusion_input_column
            && item_data_input_column == other.item_data_input_column
            && item_list_output_column == other.item_list_output_column
            && item_score_output_column == other.item_score_output_column
            && string_id_values == other.string_id_values
            && integer_id_values == other.integer_id_values);

  }